

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  char *pcVar1;
  InternalRunDeathTestFlag *pIVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  int *piVar9;
  void *__addr;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  undefined8 *extraout_RAX_04;
  undefined8 *extraout_RAX_05;
  undefined8 *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  ulong *puVar10;
  __sighandler_t p_Var11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  _union_1457 extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  _union_1457 extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar15;
  ulong uVar16;
  undefined8 uVar17;
  const_iterator __position;
  size_t __len;
  int pipe_fd [2];
  int death_test_index;
  Arguments args;
  ExecDeathTestArgs args_2;
  string internal_flag;
  sigaction ignore_sigprof_action;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  string filter_flag;
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  long local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  long local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  int local_20c;
  int local_208;
  int local_204;
  string local_200;
  string local_1e0;
  char *local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  string local_1a0;
  _union_1457 local_180;
  undefined1 local_178 [8];
  ulong local_170;
  ulong uStack_168;
  _union_1457 local_e8;
  long local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [8];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  UnitTest::GetInstance();
  pIVar2 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_).ptr_;
  local_204 = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar2 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar2->write_fd_;
    return EXECUTE_TEST;
  }
  iVar4 = pipe(&local_20c);
  if (iVar4 == -1) {
    local_2f0 = &local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    local_310 = (ulong *)*puVar8;
    puVar10 = puVar8 + 2;
    if (local_310 == puVar10) {
      local_300 = *puVar10;
      lStack_2f8 = puVar8[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *puVar10;
    }
    local_308 = puVar8[1];
    *puVar8 = puVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_310);
    local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if (local_2d0 == paVar13) {
      local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2c0._8_8_ = plVar7[3];
      local_2d0 = &local_2c0;
    }
    else {
      local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2c8 = plVar7[1];
    *plVar7 = (long)paVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_250._M_dataplus._M_p._0_4_ = 0x46b;
    StreamableToString<int>(&local_290,(int *)&local_250);
    uVar17 = 0xf;
    if (local_2d0 != &local_2c0) {
      uVar17 = local_2c0._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_290._M_string_length + local_2c8) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar17 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_290._M_string_length + local_2c8) goto LAB_0032e5df;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
    }
    else {
LAB_0032e5df:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2b0._M_dataplus._M_p = (pointer)*puVar8;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar13) {
      local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = puVar8[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2b0._M_string_length = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    paVar13->_M_local_buf[0] = '\0';
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    local_180.sa_handler = (__sighandler_t)*puVar8;
    p_Var11 = (__sighandler_t)(puVar8 + 2);
    if (local_180.sa_handler == p_Var11) {
      local_170 = *(ulong *)p_Var11;
      uStack_168 = puVar8[3];
      local_180.sa_handler = (__sighandler_t)&local_170;
    }
    else {
      local_170 = *(ulong *)p_Var11;
    }
    local_178 = (undefined1  [8])puVar8[1];
    *puVar8 = p_Var11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
    local_e8.sa_handler = (__sighandler_t)*puVar8;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.sa_handler == paVar13) {
      local_d8[0]._0_8_ = paVar13->_M_allocated_capacity;
      local_d8[0]._8_8_ = puVar8[3];
      local_e8.sa_handler = (__sighandler_t)local_d8;
    }
    else {
      local_d8[0]._0_8_ = paVar13->_M_allocated_capacity;
    }
    local_e0 = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    DeathTestAbort((string *)&local_e8);
    puVar8 = extraout_RAX_02;
    local_e8 = extraout_RDX_02;
LAB_0032f02c:
    local_d8[0]._0_8_ = paVar13->_M_allocated_capacity;
  }
  else {
    iVar4 = fcntl(local_208,2,0);
    if (iVar4 != -1) {
      local_2f0 = &local_2e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"--","");
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_300 = *puVar10;
        lStack_2f8 = plVar7[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar10;
        local_310 = (ulong *)*plVar7;
      }
      local_308 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_310);
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar13) {
        local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2c0._8_8_ = plVar7[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7;
      }
      local_2c8 = plVar7[1];
      *plVar7 = (long)paVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar13) {
        local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = plVar7[3];
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2b0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_2b0._M_string_length = plVar7[1];
      *plVar7 = (long)paVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_180.sa_handler = (__sighandler_t)&local_170;
      p_Var11 = (__sighandler_t)(plVar7 + 2);
      if ((__sighandler_t)*plVar7 == p_Var11) {
        local_170 = *(ulong *)p_Var11;
        uStack_168 = plVar7[3];
      }
      else {
        local_170 = *(ulong *)p_Var11;
        local_180.sa_handler = (__sighandler_t)*plVar7;
      }
      local_178 = (undefined1  [8])plVar7[1];
      *plVar7 = (long)p_Var11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar13) {
        local_d8[0]._0_8_ = paVar13->_M_allocated_capacity;
        local_d8[0]._8_8_ = puVar8[3];
        local_e8.sa_handler = (__sighandler_t)local_d8;
      }
      else {
        local_d8[0]._0_8_ = paVar13->_M_allocated_capacity;
        local_e8.sa_handler = (__sighandler_t)*puVar8;
      }
      local_e0 = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_50 = &local_40;
      plVar12 = plVar7 + 2;
      if ((long *)*plVar7 == plVar12) {
        local_40 = *plVar12;
        lStack_38 = plVar7[3];
      }
      else {
        local_40 = *plVar12;
        local_50 = (long *)*plVar7;
      }
      local_48 = plVar7[1];
      *plVar7 = (long)plVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.sa_handler != local_d8) {
        operator_delete(local_e8.sa_handler);
      }
      if (local_180.sa_handler != (__sighandler_t)&local_170) {
        operator_delete(local_180.sa_handler);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0);
      }
      if (local_310 != &local_300) {
        operator_delete(local_310);
      }
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0);
      }
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--","");
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      puVar10 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_270.field_2._M_allocated_capacity = *puVar10;
        local_270.field_2._8_8_ = plVar7[3];
      }
      else {
        local_270.field_2._M_allocated_capacity = *puVar10;
        local_270._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_270._M_string_length = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_270);
      puVar10 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_250.field_2._M_allocated_capacity = *puVar10;
        local_250.field_2._8_8_ = plVar7[3];
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      }
      else {
        local_250.field_2._M_allocated_capacity = *puVar10;
        local_250._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_250._M_string_length = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_250);
      puVar10 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_290.field_2._M_allocated_capacity = *puVar10;
        local_290.field_2._8_8_ = plVar7[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *puVar10;
        local_290._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_290._M_string_length = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar13) {
        local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2e0._8_8_ = puVar8[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar8;
      }
      local_2e8 = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_300 = *puVar10;
        lStack_2f8 = plVar7[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar10;
        local_310 = (ulong *)*plVar7;
      }
      local_308 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      StreamableToString<int>(&local_200,&this->line_);
      uVar16 = 0xf;
      if (local_310 != &local_300) {
        uVar16 = local_300;
      }
      if (uVar16 < local_200._M_string_length + local_308) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          uVar17 = local_200.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_200._M_string_length + local_308) goto LAB_0032d1b9;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_310);
      }
      else {
LAB_0032d1b9:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_310,(ulong)local_200._M_dataplus._M_p);
      }
      local_2d0 = &local_2c0;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar13) {
        local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2c0._8_8_ = puVar8[3];
      }
      else {
        local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar8;
      }
      local_2c8 = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      paVar13->_M_local_buf[0] = '\0';
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar13) {
        local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = puVar8[3];
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2b0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_2b0._M_string_length = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      StreamableToString<int>(&local_1e0,&local_204);
      uVar16 = CONCAT44(local_1e0._M_string_length._4_4_,(int)local_1e0._M_string_length) +
               local_2b0._M_string_length;
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar17 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < uVar16) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          uVar17 = local_1e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < uVar16) goto LAB_0032d2e1;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1e0,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
      }
      else {
LAB_0032d2e1:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b0,(ulong)local_1e0._M_dataplus._M_p);
      }
      local_180.sa_handler = (__sighandler_t)&local_170;
      p_Var11 = (__sighandler_t)(puVar8 + 2);
      if ((__sighandler_t)*puVar8 == p_Var11) {
        local_170 = *(ulong *)p_Var11;
        uStack_168 = puVar8[3];
      }
      else {
        local_170 = *(ulong *)p_Var11;
        local_180.sa_handler = (__sighandler_t)*puVar8;
      }
      local_178 = (undefined1  [8])puVar8[1];
      *puVar8 = p_Var11;
      puVar8[1] = 0;
      *p_Var11 = (__sighandler_t)0x0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar13) {
        local_d8[0]._0_8_ = paVar13->_M_allocated_capacity;
        local_d8[0]._8_8_ = puVar8[3];
        local_e8.sa_handler = (__sighandler_t)local_d8;
      }
      else {
        local_d8[0]._0_8_ = paVar13->_M_allocated_capacity;
        local_e8.sa_handler = (__sighandler_t)*puVar8;
      }
      local_e0 = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      StreamableToString<int>(&local_1a0,&local_208);
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.sa_handler != local_d8) {
        uVar17 = local_d8[0]._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_e0 + local_1a0._M_string_length) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
            &local_1a0.field_2) {
          uVar17 = local_1a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_e0 + local_1a0._M_string_length) goto LAB_0032d428;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_e8);
      }
      else {
LAB_0032d428:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_e8,
                            CONCAT44(local_1a0._M_dataplus._M_p._4_4_,
                                     local_1a0._M_dataplus._M_p._0_4_));
      }
      local_1c0 = (char *)&local_1b0;
      pcVar1 = (char *)(puVar8 + 2);
      if ((char *)*puVar8 == pcVar1) {
        local_1b0 = *(undefined8 *)pcVar1;
        uStack_1a8 = puVar8[3];
      }
      else {
        local_1b0 = *(undefined8 *)pcVar1;
        local_1c0 = (char *)*puVar8;
      }
      local_1b8 = puVar8[1];
      *puVar8 = pcVar1;
      puVar8[1] = 0;
      *pcVar1 = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
          &local_1a0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_))
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.sa_handler != local_d8) {
        operator_delete(local_e8.sa_handler);
      }
      if (local_180.sa_handler != (__sighandler_t)&local_170) {
        operator_delete(local_180.sa_handler);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
      if (local_310 != &local_300) {
        operator_delete(local_310);
      }
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      Arguments::Arguments((Arguments *)&local_200);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&g_argvs_abi_cxx11_;
      if (g_injected_test_argvs_abi_cxx11_ !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        __x = g_injected_test_argvs_abi_cxx11_;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_e8,__x);
      Arguments::AddArguments<std::__cxx11::string>
                ((Arguments *)&local_200,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_e8);
      __position._M_current = (char **)(local_200._M_string_length - 8);
      local_e8.sa_handler = (__sighandler_t)strdup((char *)local_50);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_200,__position,
                 (value_type *)&local_e8.sa_handler);
      local_e8.sa_handler = (__sighandler_t)strdup(local_1c0);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_200,
                 (char **)(local_200._M_string_length - 8),(value_type *)&local_e8.sa_handler);
      local_e8.sa_handler = (__sighandler_t)local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.sa_handler != local_d8) {
        operator_delete(local_e8.sa_handler);
      }
      CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
      fflush((FILE *)0x0);
      local_1e0._M_dataplus._M_p = local_200._M_dataplus._M_p;
      local_1e0._M_string_length._0_4_ = local_20c;
      memset(&local_180,0,0x98);
      sigemptyset((sigset_t *)local_178);
      local_180 = (_union_1457)0x1;
      do {
        iVar4 = sigaction(0x1b,(sigaction *)&local_180,(sigaction *)&local_e8);
        cVar3 = FLAGS_gtest_death_test_use_fork;
        if (iVar4 != -1) {
          iVar4 = -1;
          if (FLAGS_gtest_death_test_use_fork == '\0') {
            if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
              AssumeRole();
            }
            uVar5 = getpagesize();
            __len = (size_t)(int)uVar5;
            __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
            if (__addr == (void *)0xffffffffffffffff) {
              local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_250,"CHECK failed: File ","");
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
              local_290._M_dataplus._M_p = (pointer)*puVar8;
              puVar10 = puVar8 + 2;
              if ((ulong *)local_290._M_dataplus._M_p == puVar10) {
                local_290.field_2._M_allocated_capacity = *puVar10;
                local_290.field_2._8_8_ = puVar8[3];
                local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
              }
              else {
                local_290.field_2._M_allocated_capacity = *puVar10;
              }
              local_290._M_string_length = puVar8[1];
              *puVar8 = puVar10;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
              local_2f0 = &local_2e0;
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar8;
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar8 + 2);
              if (paVar13 != paVar14) goto LAB_0032e91d;
              local_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
              local_2e0._8_8_ = puVar8[3];
              goto LAB_0032e92a;
            }
            lVar15 = 0;
            if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
              lVar15 = __len - 0x40;
            }
            if ((0x40 < uVar5) && (((ulong)(lVar15 + (long)__addr) & 0x3f) == 0)) {
              iVar4 = clone(ExecDeathTestChildMain,(void *)(lVar15 + (long)__addr),0x11,&local_1e0);
              iVar6 = munmap(__addr,__len);
              if (iVar6 != -1) goto LAB_0032d85e;
              goto LAB_0032df94;
            }
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_250,"CHECK failed: File ","");
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
            local_290._M_dataplus._M_p = (pointer)*puVar8;
            puVar10 = puVar8 + 2;
            if ((ulong *)local_290._M_dataplus._M_p == puVar10) {
              local_290.field_2._M_allocated_capacity = *puVar10;
              local_290.field_2._8_8_ = puVar8[3];
              local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            }
            else {
              local_290.field_2._M_allocated_capacity = *puVar10;
            }
            local_290._M_string_length = puVar8[1];
            *puVar8 = puVar10;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
            local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar8;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar8 + 2);
            if (local_2f0 == paVar13) {
              local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_2e0._8_8_ = puVar8[3];
              local_2f0 = &local_2e0;
            }
            else {
              local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
            }
            local_2e8 = puVar8[1];
            *puVar8 = paVar13;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            local_230._M_dataplus._M_p._0_4_ = 0x442;
            StreamableToString<int>(&local_270,(int *)&local_230);
            uVar17 = 0xf;
            if (local_2f0 != &local_2e0) {
              uVar17 = local_2e0._M_allocated_capacity;
            }
            if ((ulong)uVar17 < local_270._M_string_length + local_2e8) {
              uVar17 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_270._M_dataplus._M_p != &local_270.field_2) {
                uVar17 = local_270.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar17 < local_270._M_string_length + local_2e8) goto LAB_0032ea62;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0);
            }
            else {
LAB_0032ea62:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
            }
            local_310 = (ulong *)*puVar8;
            puVar10 = puVar8 + 2;
            if (local_310 == puVar10) {
              local_300 = *puVar10;
              lStack_2f8 = puVar8[3];
              local_310 = &local_300;
            }
            else {
              local_300 = *puVar10;
            }
            local_308 = puVar8[1];
            *puVar8 = puVar10;
            puVar8[1] = 0;
            *(undefined1 *)puVar10 = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
            local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar8;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar8 + 2);
            if (local_2d0 == paVar13) {
              local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_2c0._8_8_ = puVar8[3];
              local_2d0 = &local_2c0;
            }
            else {
              local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
            }
            local_2c8 = puVar8[1];
            *puVar8 = paVar13;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8;
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar8 + 2);
            if (paVar13 != paVar14) goto LAB_0032f1e5;
            local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_2b0.field_2._8_8_ = puVar8[3];
            goto LAB_0032f1f2;
          }
LAB_0032d85e:
          if ((cVar3 == '\0') || (iVar4 = fork(), iVar4 != 0)) {
            goto LAB_0032d87a;
          }
          ExecDeathTestChildMain(&local_1e0);
LAB_0032df94:
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_250,"CHECK failed: File ","");
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
          local_290._M_dataplus._M_p = (pointer)*puVar8;
          puVar10 = puVar8 + 2;
          if ((ulong *)local_290._M_dataplus._M_p == puVar10) {
            local_290.field_2._M_allocated_capacity = *puVar10;
            local_290.field_2._8_8_ = puVar8[3];
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          }
          else {
            local_290.field_2._M_allocated_capacity = *puVar10;
          }
          local_290._M_string_length = puVar8[1];
          *puVar8 = puVar10;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
          local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar8 + 2);
          if (local_2f0 == paVar13) {
            local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_2e0._8_8_ = puVar8[3];
            local_2f0 = &local_2e0;
          }
          else {
            local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
          }
          local_2e8 = puVar8[1];
          *puVar8 = paVar13;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          local_230._M_dataplus._M_p._0_4_ = 0x446;
          StreamableToString<int>(&local_270,(int *)&local_230);
          uVar17 = 0xf;
          if (local_2f0 != &local_2e0) {
            uVar17 = local_2e0._M_allocated_capacity;
          }
          if ((ulong)uVar17 < local_270._M_string_length + local_2e8) {
            uVar17 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              uVar17 = local_270.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar17 < local_270._M_string_length + local_2e8) goto LAB_0032eb10;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0)
            ;
          }
          else {
LAB_0032eb10:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
          }
          local_310 = (ulong *)*puVar8;
          puVar10 = puVar8 + 2;
          if (local_310 == puVar10) {
            local_300 = *puVar10;
            lStack_2f8 = puVar8[3];
            local_310 = &local_300;
          }
          else {
            local_300 = *puVar10;
          }
          local_308 = puVar8[1];
          *puVar8 = puVar10;
          puVar8[1] = 0;
          *(undefined1 *)puVar10 = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
          local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar8 + 2);
          if (local_2d0 == paVar13) {
            local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_2c0._8_8_ = puVar8[3];
            local_2d0 = &local_2c0;
          }
          else {
            local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
          }
          local_2c8 = puVar8[1];
          *puVar8 = paVar13;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar8;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar8 + 2);
          if (paVar13 != paVar14) goto LAB_0032f213;
          local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_2b0.field_2._8_8_ = puVar8[3];
          goto LAB_0032f220;
        }
        piVar9 = __errno_location();
      } while (*piVar9 == 4);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","")
      ;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
      local_250._M_dataplus._M_p = (pointer)*puVar8;
      puVar10 = puVar8 + 2;
      if ((ulong *)local_250._M_dataplus._M_p == puVar10) {
        local_250.field_2._M_allocated_capacity = *puVar10;
        local_250.field_2._8_8_ = puVar8[3];
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      }
      else {
        local_250.field_2._M_allocated_capacity = *puVar10;
      }
      local_250._M_string_length = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
      local_290._M_dataplus._M_p = (pointer)*puVar8;
      puVar10 = puVar8 + 2;
      if ((ulong *)local_290._M_dataplus._M_p == puVar10) {
        local_290.field_2._M_allocated_capacity = *puVar10;
        local_290.field_2._8_8_ = puVar8[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *puVar10;
      }
      local_290._M_string_length = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      local_1a0._M_dataplus._M_p._0_4_ = 0x429;
      StreamableToString<int>(&local_230,(int *)&local_1a0);
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar17 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_230._M_string_length + local_290._M_string_length) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          uVar17 = local_230.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_230._M_string_length + local_290._M_string_length)
        goto LAB_0032dbeb;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_230,0,(char *)0x0,(ulong)local_290._M_dataplus._M_p);
      }
      else {
LAB_0032dbeb:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_290,(ulong)local_230._M_dataplus._M_p);
      }
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if (local_2f0 == paVar13) {
        local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2e0._8_8_ = puVar8[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_2e8 = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      paVar13->_M_local_buf[0] = '\0';
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
      local_310 = (ulong *)*puVar8;
      puVar10 = puVar8 + 2;
      if (local_310 == puVar10) {
        local_300 = *puVar10;
        lStack_2f8 = puVar8[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar10;
      }
      local_308 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if (local_2d0 == paVar13) {
        local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2c0._8_8_ = puVar8[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_2c8 = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)*puVar8;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar14) {
        local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = puVar8[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_2b0._M_string_length = puVar8[1];
      *puVar8 = paVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      DeathTestAbort(&local_2b0);
      puVar8 = extraout_RAX;
      paVar13 = extraout_RDX;
      goto LAB_0032e8b8;
    }
    local_2f0 = &local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    local_310 = (ulong *)*puVar8;
    puVar10 = puVar8 + 2;
    if (local_310 == puVar10) {
      local_300 = *puVar10;
      lStack_2f8 = puVar8[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *puVar10;
    }
    local_308 = puVar8[1];
    *puVar8 = puVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
    local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if (local_2d0 == paVar13) {
      local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2c0._8_8_ = puVar8[3];
      local_2d0 = &local_2c0;
    }
    else {
      local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2c8 = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    local_250._M_dataplus._M_p._0_4_ = 0x46e;
    StreamableToString<int>(&local_290,(int *)&local_250);
    uVar17 = 0xf;
    if (local_2d0 != &local_2c0) {
      uVar17 = local_2c0._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_290._M_string_length + local_2c8) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar17 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_290._M_string_length + local_2c8) goto LAB_0032e684;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
    }
    else {
LAB_0032e684:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2b0._M_dataplus._M_p = (pointer)*puVar8;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar13) {
      local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = puVar8[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2b0._M_string_length = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    paVar13->_M_local_buf[0] = '\0';
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    local_180.sa_handler = (__sighandler_t)*puVar8;
    p_Var11 = (__sighandler_t)(puVar8 + 2);
    if (local_180.sa_handler == p_Var11) {
      local_170 = *(ulong *)p_Var11;
      uStack_168 = puVar8[3];
      local_180.sa_handler = (__sighandler_t)&local_170;
    }
    else {
      local_170 = *(ulong *)p_Var11;
    }
    local_178 = (undefined1  [8])puVar8[1];
    *puVar8 = p_Var11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
    local_e8.sa_handler = (__sighandler_t)*puVar8;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.sa_handler != paVar13) goto LAB_0032f02c;
    local_d8[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_d8[0]._8_8_ = puVar8[3];
    local_e8.sa_handler = (__sighandler_t)local_d8;
  }
  local_e0 = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort((string *)&local_e8);
  puVar8 = extraout_RAX_03;
  local_2d0 = extraout_RDX_03;
  goto LAB_0032f063;
LAB_0032d911:
  do {
    iVar6 = close(local_208);
    if (iVar6 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = iVar4;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_20c;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)&local_200);
      if (local_1c0 != (char *)&local_1b0) {
        operator_delete(local_1c0);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      return OVERSEE_TEST;
    }
    piVar9 = __errno_location();
  } while (*piVar9 == 4);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
  local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (local_2f0 == paVar13) {
    local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2e0._8_8_ = puVar8[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_2e8 = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_310 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = puVar8[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar10;
  }
  local_308 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_270._M_dataplus._M_p._0_4_ = 0x485;
  StreamableToString<int>(&local_250,(int *)&local_270);
  uVar16 = 0xf;
  if (local_310 != &local_300) {
    uVar16 = local_300;
  }
  if (uVar16 < local_250._M_string_length + local_308) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar17 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_250._M_string_length + local_308) goto LAB_0032dd62;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_310);
  }
  else {
LAB_0032dd62:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_250._M_dataplus._M_p);
  }
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (local_2d0 == paVar13) {
    local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2c0._8_8_ = puVar8[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_2c8 = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  paVar13->_M_local_buf[0] = '\0';
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)*puVar8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar13) {
    local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar8[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_2b0._M_string_length = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  local_180.sa_handler = (__sighandler_t)*plVar7;
  p_Var11 = (__sighandler_t)(plVar7 + 2);
  if (local_180.sa_handler == p_Var11) {
    local_170 = *(ulong *)p_Var11;
    uStack_168 = plVar7[3];
    local_180.sa_handler = (__sighandler_t)&local_170;
  }
  else {
    local_170 = *(ulong *)p_Var11;
  }
  local_178 = (undefined1  [8])plVar7[1];
  *plVar7 = (long)p_Var11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
  local_e8.sa_handler = (__sighandler_t)*puVar8;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.sa_handler != paVar14) goto LAB_0032e8e6;
  local_d8[0]._0_8_ = paVar14->_M_allocated_capacity;
  local_d8[0]._8_8_ = puVar8[3];
  local_e8.sa_handler = (__sighandler_t)local_d8;
  goto LAB_0032e8f9;
  while (piVar9 = __errno_location(), *piVar9 == 4) {
LAB_0032d87a:
    iVar6 = sigaction(0x1b,(sigaction *)&local_e8,(sigaction *)0x0);
    if (iVar6 != -1) {
      if (iVar4 != -1) goto LAB_0032d911;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","")
      ;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
      local_290._M_dataplus._M_p = (pointer)*puVar8;
      puVar10 = puVar8 + 2;
      if ((ulong *)local_290._M_dataplus._M_p == puVar10) {
        local_290.field_2._M_allocated_capacity = *puVar10;
        local_290.field_2._8_8_ = puVar8[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *puVar10;
      }
      local_290._M_string_length = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if (local_2f0 == paVar13) {
        local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2e0._8_8_ = puVar8[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_2e8 = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      local_230._M_dataplus._M_p._0_4_ = 0x456;
      StreamableToString<int>(&local_270,(int *)&local_230);
      uVar17 = 0xf;
      if (local_2f0 != &local_2e0) {
        uVar17 = local_2e0._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_270._M_string_length + local_2e8) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          uVar17 = local_270.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_270._M_string_length + local_2e8) goto LAB_0032e873;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0);
      }
      else {
LAB_0032e873:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
      }
      local_310 = (ulong *)*puVar8;
      puVar10 = puVar8 + 2;
      if (local_310 == puVar10) {
        local_300 = *puVar10;
        lStack_2f8 = puVar8[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar10;
      }
      local_308 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)puVar10 = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if (local_2d0 == paVar13) {
        local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2c0._8_8_ = puVar8[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_2c8 = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)*plVar7;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar14) {
        local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = plVar7[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_2b0._M_string_length = plVar7[1];
      *plVar7 = (long)paVar14;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      DeathTestAbort(&local_2b0);
      puVar8 = extraout_RAX_04;
      local_2b0._M_dataplus._M_p = (pointer)extraout_RDX_04;
      goto LAB_0032f1b7;
    }
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
  local_250._M_dataplus._M_p = (pointer)*puVar8;
  puVar10 = puVar8 + 2;
  if ((ulong *)local_250._M_dataplus._M_p == puVar10) {
    local_250.field_2._M_allocated_capacity = *puVar10;
    local_250.field_2._8_8_ = puVar8[3];
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  }
  else {
    local_250.field_2._M_allocated_capacity = *puVar10;
  }
  local_250._M_string_length = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
  local_290._M_dataplus._M_p = (pointer)*puVar8;
  puVar10 = puVar8 + 2;
  if ((ulong *)local_290._M_dataplus._M_p == puVar10) {
    local_290.field_2._M_allocated_capacity = *puVar10;
    local_290.field_2._8_8_ = puVar8[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = *puVar10;
  }
  local_290._M_string_length = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_1a0._M_dataplus._M_p._0_4_ = 0x453;
  StreamableToString<int>(&local_230,(int *)&local_1a0);
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    uVar17 = local_290.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_230._M_string_length + local_290._M_string_length) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar17 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_230._M_string_length + local_290._M_string_length) goto LAB_0032dcb1;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_230,0,(char *)0x0,(ulong)local_290._M_dataplus._M_p);
  }
  else {
LAB_0032dcb1:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_230._M_dataplus._M_p);
  }
  local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (local_2f0 == paVar13) {
    local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2e0._8_8_ = puVar8[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_2e8 = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  paVar13->_M_local_buf[0] = '\0';
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_310 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = puVar8[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar10;
  }
  local_308 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (local_2d0 == paVar13) {
    local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2c0._8_8_ = puVar8[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_2c8 = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (paVar13 == paVar14) {
    local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar8[3];
  }
  else {
LAB_0032e8b8:
    local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_2b0._M_dataplus._M_p = (pointer)paVar13;
  }
  local_2b0._M_string_length = puVar8[1];
  *puVar8 = paVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar8 = extraout_RAX_00;
  local_e8 = extraout_RDX_00;
LAB_0032e8e6:
  local_d8[0]._0_8_ = paVar14->_M_allocated_capacity;
LAB_0032e8f9:
  local_e0 = puVar8[1];
  *puVar8 = paVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort((string *)&local_e8);
  puVar8 = extraout_RAX_01;
  paVar13 = extraout_RDX_01;
LAB_0032e91d:
  local_2e0._M_allocated_capacity = paVar14->_M_allocated_capacity;
  local_2f0 = paVar13;
LAB_0032e92a:
  local_2e8 = puVar8[1];
  *puVar8 = paVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_230._M_dataplus._M_p._0_4_ = 0x435;
  StreamableToString<int>(&local_270,(int *)&local_230);
  uVar17 = 0xf;
  if (local_2f0 != &local_2e0) {
    uVar17 = local_2e0._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_270._M_string_length + local_2e8) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      uVar17 = local_270.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_270._M_string_length + local_2e8) goto LAB_0032e9b4;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0);
  }
  else {
LAB_0032e9b4:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
  }
  local_310 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_310 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = puVar8[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar10;
  }
  local_308 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)puVar10 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (local_2d0 == paVar13) {
    local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2c0._8_8_ = puVar8[3];
    local_2d0 = &local_2c0;
  }
  else {
LAB_0032f063:
    local_2c0._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_2c8 = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)*puVar8;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar14) {
    local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar8[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
LAB_0032f1b7:
    local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
  }
  local_2b0._M_string_length = puVar8[1];
  *puVar8 = paVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar8 = extraout_RAX_05;
  paVar13 = extraout_RDX_05;
LAB_0032f1e5:
  local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
  local_2b0._M_dataplus._M_p = (pointer)paVar13;
LAB_0032f1f2:
  local_2b0._M_string_length = puVar8[1];
  *puVar8 = paVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar8 = extraout_RAX_06;
  paVar13 = extraout_RDX_06;
LAB_0032f213:
  local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
  local_2b0._M_dataplus._M_p = (pointer)paVar13;
LAB_0032f220:
  local_2b0._M_string_length = puVar8[1];
  *puVar8 = paVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  Arguments::~Arguments((Arguments *)&local_200);
  if (local_1c0 != (char *)&local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kFilterFlag + "="
      + info->test_case_name() + "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}